

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderOutput.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderDuplicateOutputLayoutQualifierTest::iterate
          (GeometryShaderDuplicateOutputLayoutQualifierTest *this)

{
  NotSupportedError *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  MessageBuilder local_1a0;
  undefined1 local_1d;
  bool result;
  GeometryShaderDuplicateOutputLayoutQualifierTest *local_10;
  GeometryShaderDuplicateOutputLayoutQualifierTest *this_local;
  
  local_10 = this;
  if (((this->super_GeometryShaderOutput).super_TestCaseBase.
       m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderOutput.cpp"
               ,0xe7);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  local_1d = TestCaseBase::doesProgramBuild
                       ((TestCaseBase *)this,1,
                        &GeometryShaderOutput::m_fragment_shader_code_white_color,1,
                        &m_geometry_shader_code,1,
                        &GeometryShaderOutput::m_vertex_shader_code_two_vec4);
  if ((bool)local_1d) {
    this_01 = tcu::TestContext::getLog
                        ((this->super_GeometryShaderOutput).super_TestCaseBase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    this_02 = tcu::MessageBuilder::operator<<
                        (&local_1a0,(char (*) [41])"Invalid program was linked successfully.");
    tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderOutput).super_TestCaseBase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderOutput).super_TestCaseBase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderDuplicateOutputLayoutQualifierTest::iterate()
{
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Verify the program does not build. */
	bool result = doesProgramBuild(1, &m_fragment_shader_code_white_color, 1, &m_geometry_shader_code, 1,
								   &m_vertex_shader_code_two_vec4);

	if (false == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid program was linked successfully."
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}